

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O0

void __thiscall
helics::RandomDelayFilterOperation::RandomDelayFilterOperation(RandomDelayFilterOperation *this)

{
  FilterOperations *in_RDI;
  FilterOperations *__args;
  
  __args = in_RDI;
  FilterOperations::FilterOperations(in_RDI);
  in_RDI->_vptr_FilterOperations = (_func_int **)&PTR__RandomDelayFilterOperation_00a65568;
  std::
  make_shared<helics::MessageTimeOperator,helics::RandomDelayFilterOperation::RandomDelayFilterOperation()::__0>
            ((anon_class_8_1_8991fb9c *)__args);
  std::make_unique<helics::RandomDelayGenerator>();
  return;
}

Assistant:

RandomDelayFilterOperation::RandomDelayFilterOperation():
    td(std::make_shared<MessageTimeOperator>(
        [this](Time messageTime) { return messageTime + rdelayGen->generate(); })),
    rdelayGen(std::make_unique<RandomDelayGenerator>())
{
}